

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

bool miillerTest(BigInt *d,BigInt *n)

{
  bool bVar1;
  bool bVar2;
  BigInt x;
  BigInt N_minus_one;
  BigInt local_d0;
  BigInt local_b0;
  BigInt local_90;
  BigInt local_70;
  BigInt random;
  
  BigInt::BigInt(&N_minus_one,2);
  random_bigint(&local_d0,
                (int)((ulong)((long)(n->vector_value).
                                    super__Vector_base<long_long,_std::allocator<long_long>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(n->vector_value).
                                   super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                                   .super__Vector_impl_data._M_start) >> 3));
  BigInt::BigInt(&local_70,4);
  BigInt::operator-(&local_b0,n,&local_70);
  BigInt::operator%(&x,&local_d0,&local_b0);
  BigInt::operator+(&random,&N_minus_one,&x);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&x);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_b0);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_70);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_d0);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&N_minus_one);
  BigInt::operator-(&N_minus_one,n,&one);
  BigInt::BigInt(&local_90,d);
  BigInt::powMod(&x,&random,&local_90,n);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_90);
  bVar1 = BigInt::operator==(&x,&one);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = BigInt::operator==(&x,&N_minus_one);
    if (!bVar1) {
      do {
        bVar1 = BigInt::operator!=(d,&N_minus_one);
        if (!bVar1) {
LAB_0010289f:
          bVar2 = false;
          goto LAB_001028a1;
        }
        BigInt::operator*(&local_b0,&x,&x);
        BigInt::operator%(&local_d0,&local_b0,n);
        BigInt::operator=(&x,&local_d0);
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_d0);
        std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
                  ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_b0);
        local_d0.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x2;
        BigInt::operator*=(d,(longlong *)&local_d0);
        bVar1 = BigInt::operator==(&x,&one);
        if (bVar1) goto LAB_0010289f;
        bVar1 = BigInt::operator==(&x,&N_minus_one);
      } while (!bVar1);
      bVar2 = true;
    }
  }
LAB_001028a1:
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&x);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&N_minus_one);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&random);
  return bVar2;
}

Assistant:

bool miillerTest(BigInt d, BigInt n) {
    //! Pick a random number in [2..n-2]
    //! Corner cases make sure that n > 4
    BigInt random = BigInt(2) + random_bigint(static_cast<int>(n.vector_value.size())) % (n - BigInt(4));

    BigInt N_minus_one = n - one;

    //! Compute a^d % n
    BigInt x = random.powMod(d, n);

    if (x == one || x == N_minus_one)
        return true;

    //! Keep squaring x while one of the following doesn't
    //! happen
    //! (i)   d does not reach n-1
    //! (ii)  (x^2) % n is not 1
    //! (iii) (x^2) % n is not n-1
    while (d != N_minus_one) {
        x = (x * x) % n;
        d *= 2;

        if (x == one) return false;
        if (x == N_minus_one) return true;
    }

    //! Return composite
    return false;
}